

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::MemoryDataParameter::InternalSerializeWithCachedSizesToArray
          (MemoryDataParameter *this,bool deterministic,uint8 *target)

{
  void *pvVar1;
  bool bVar2;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 1) != 0) {
    uVar5 = this->batch_size_;
    *target = '\b';
    pbVar6 = target + 1;
    uVar7 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar6 = (byte)uVar5 | 0x80;
        uVar7 = uVar5 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar7;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar7;
    target = pbVar6 + 1;
  }
  if ((uVar4 & 2) != 0) {
    uVar5 = this->channels_;
    *target = 0x10;
    pbVar6 = target + 1;
    uVar7 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar6 = (byte)uVar5 | 0x80;
        uVar7 = uVar5 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar7;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar7;
    target = pbVar6 + 1;
  }
  if ((uVar4 & 4) != 0) {
    uVar5 = this->height_;
    *target = 0x18;
    pbVar6 = target + 1;
    uVar7 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar6 = (byte)uVar5 | 0x80;
        uVar7 = uVar5 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar7;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar7;
    target = pbVar6 + 1;
  }
  if ((uVar4 & 8) != 0) {
    uVar4 = this->width_;
    *target = 0x20;
    pbVar6 = target + 1;
    uVar5 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar6 = (byte)uVar4 | 0x80;
        uVar5 = uVar4 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar4;
        uVar4 = uVar5;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar5;
    target = pbVar6 + 1;
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    puVar3 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),target);
    return puVar3;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* MemoryDataParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.MemoryDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 batch_size = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->batch_size(), target);
  }

  // optional uint32 channels = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(2, this->channels(), target);
  }

  // optional uint32 height = 3;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3, this->height(), target);
  }

  // optional uint32 width = 4;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4, this->width(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.MemoryDataParameter)
  return target;
}